

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O2

void __thiscall Code_generator::visit(Code_generator *this,Inst_mrs *s)

{
  Register *pRVar1;
  uint uVar2;
  allocator local_39;
  string local_38;
  
  ast::Instruction::check_alignment(&s->super_Instruction);
  pRVar1 = s->rs;
  uVar2 = pRVar1->n;
  if ((uVar2 & 0xfffffffe) != 0x12e) {
    std::__cxx11::string::string((string *)&local_38,"Invalid register",&local_39);
    error_report(&pRVar1->location,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    uVar2 = s->rs->n;
  }
  ast::Sections::write16
            ((s->super_Instruction).super_Statement.section_index,
             (s->super_Instruction).super_Statement.section_offset,
             (ushort)s->rd->n | (ushort)(uVar2 == 0x12f) << 4 | 0xb060);
  return;
}

Assistant:

void Code_generator::visit(Inst_mrs *s)
{
	s->check_alignment();
	if (s->rs->n != CPSR && s->rs->n != SPSR)
		error_report(&s->rs->location, "Invalid register");
	Sections::write16(s->section_index, s->section_offset,
		static_cast<uint16_t>(MRS_OPCODE
			| ((s->rs->n == SPSR) << SPSR_INDICATION_POSITION)
			| (s->rd->n << RD_POSITION)));
}